

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  char *pcVar1;
  FILE *__stream;
  char *__s;
  luaL_Buffer buff;
  luaL_Buffer b;
  luaL_Buffer local_868;
  luaL_Buffer local_448;
  
  if ((*sep != '\0') && (pcVar1 = strchr(name,(int)*sep), pcVar1 != (char *)0x0)) {
    name = luaL_gsub(L,name,sep,dirsep);
  }
  luaL_buffinit(L,&local_868);
  luaL_addgsub(&local_868,path,"?",name);
  if (local_868.size <= local_868.n) {
    luaL_prepbuffsize(&local_868,1);
  }
  local_868.b[local_868.n] = '\0';
  pcVar1 = local_868.b + local_868.n;
  local_868.n = local_868.n + 1;
  do {
    if (local_868.b == pcVar1) {
      luaL_pushresult(&local_868);
      pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
      luaL_buffinit(L,&local_448);
      luaL_addstring(&local_448,"no file \'");
      luaL_addgsub(&local_448,pcVar1,";","\'\n\tno file \'");
      luaL_addstring(&local_448,"\'");
      luaL_pushresult(&local_448);
      return (char *)0x0;
    }
    __s = local_868.b;
    if (*local_868.b == '\0') {
      *local_868.b = ';';
      __s = local_868.b + 1;
    }
    local_868.b = strchr(__s,0x3b);
    if (local_868.b == (char *)0x0) {
      local_868.b = pcVar1;
    }
    *local_868.b = '\0';
    __stream = fopen64(__s,"r");
  } while (__stream == (FILE *)0x0);
  fclose(__stream);
  pcVar1 = lua_pushstring(L,__s);
  return pcVar1;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
                                             const char *path,
                                             const char *sep,
                                             const char *dirsep) {
  luaL_Buffer buff;
  char *pathname;  /* path with name inserted */
  char *endpathname;  /* its end */
  const char *filename;
  /* separator is non-empty and appears in 'name'? */
  if (*sep != '\0' && strchr(name, *sep) != NULL)
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  luaL_buffinit(L, &buff);
  /* add path to the buffer, replacing marks ('?') with the file name */
  luaL_addgsub(&buff, path, LUA_PATH_MARK, name);
  luaL_addchar(&buff, '\0');
  pathname = luaL_buffaddr(&buff);  /* writable list of file names */
  endpathname = pathname + luaL_bufflen(&buff) - 1;
  while ((filename = getnextfilename(&pathname, endpathname)) != NULL) {
    if (readable(filename))  /* does file exist and is readable? */
      return lua_pushstring(L, filename);  /* save and return name */
  }
  luaL_pushresult(&buff);  /* push path to create error message */
  pusherrornotfound(L, lua_tostring(L, -1));  /* create error message */
  return NULL;  /* not found */
}